

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
              (Mat *a,float b,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RDI;
  uint in_XMM0_Da;
  float fVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar4 [32];
  undefined8 uVar8;
  __m128 afVar9;
  __m128 _p_1;
  __m128 _b;
  __m256 _p;
  __m256 _b_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_min op;
  Mat *m;
  __m256 *in_stack_fffffffffffffd40;
  binary_op_min *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  uint uVar10;
  float local_280 [2];
  float afStack_278 [2];
  float local_270 [4];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  int local_21c;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined4 local_200;
  long local_1f8;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined8 local_1d8;
  float *local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  binary_op_min local_1b9 [13];
  uint local_1ac;
  long *local_1a8;
  undefined8 *local_1a0;
  undefined1 local_195;
  int local_194;
  undefined8 *local_188;
  undefined8 *local_178;
  uint local_16c;
  float *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  float *local_138;
  uint local_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_11c;
  float *local_118;
  float local_110 [2];
  float afStack_108 [2];
  float *local_100;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  float *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined8 *local_98;
  undefined1 local_80 [32];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_1c0 = (int)in_RDI[7];
  local_1c4 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_1ac = in_XMM0_Da;
  local_1a8 = in_RDI;
  for (local_1c8 = 0; local_1c8 < local_1c0; local_1c8 = local_1c8 + 1) {
    local_188 = &local_218;
    local_cc = *(int *)((long)local_1a8 + 0x2c);
    local_d0 = (int)local_1a8[6];
    local_d4 = *(undefined4 *)((long)local_1a8 + 0x34);
    local_1d0 = (float *)(*local_1a8 + local_1a8[8] * (long)local_1c8 * local_1a8[2]);
    local_e8 = local_1a8[2];
    local_ec = (undefined4)local_1a8[3];
    local_f8 = local_1a8[4];
    local_c8 = &local_218;
    local_b8 = (long)local_cc * (long)local_d0 * local_e8;
    local_178 = &local_218;
    local_1a0 = &local_218;
    local_bc = 0x10;
    local_194 = local_1c8;
    local_195 = 1;
    local_218 = 0;
    local_208 = 0;
    local_200 = 0;
    local_1f0 = 0;
    local_1ec = 0;
    local_1e8 = 0;
    local_1e4 = 0;
    local_1e0 = 0;
    local_1d8 = 0;
    local_210 = 0;
    local_21c = 0;
    local_16c = local_1ac;
    local_34 = local_1ac;
    local_38 = local_1ac;
    local_3c = local_1ac;
    local_40 = local_1ac;
    local_44 = local_1ac;
    local_48 = local_1ac;
    local_4c = local_1ac;
    local_50 = local_1ac;
    auVar1 = vinsertps_avx(ZEXT416(local_1ac),ZEXT416(local_1ac),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1ac),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1ac),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_1ac),ZEXT416(local_1ac),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1ac),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1ac),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_80._0_8_ = auVar2._0_8_;
    local_80._8_8_ = auVar2._8_8_;
    local_80._16_8_ = auVar1._0_8_;
    local_80._24_8_ = auVar1._8_8_;
    local_240 = local_80._0_8_;
    uStack_238 = local_80._8_8_;
    uStack_230 = local_80._16_8_;
    uStack_228 = local_80._24_8_;
    uVar10 = local_1ac;
    local_e0 = local_1d0;
    local_98 = local_1a0;
    local_80 = auVar4;
    local_1f8 = local_f8;
    for (; local_21c + 7 < local_1c4; local_21c = local_21c + 8) {
      local_168 = local_1d0;
      uVar6 = *(undefined8 *)local_1d0;
      uVar5 = *(undefined8 *)(local_1d0 + 2);
      uVar7 = *(undefined8 *)(local_1d0 + 4);
      uVar8 = *(undefined8 *)(local_1d0 + 6);
      local_260 = uVar6;
      uStack_258 = uVar5;
      uStack_250 = uVar7;
      uStack_248 = uVar8;
      BinaryOp_x86_fma_functor::binary_op_min::func_pack8
                ((binary_op_min *)CONCAT44(uVar10,in_stack_fffffffffffffd50),
                 (__m256 *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      local_138 = local_1d0;
      *(undefined8 *)local_1d0 = uVar6;
      *(undefined8 *)(local_1d0 + 2) = uVar5;
      *(undefined8 *)(local_1d0 + 4) = uVar7;
      *(undefined8 *)(local_1d0 + 6) = uVar8;
      local_1d0 = local_1d0 + 8;
      local_260 = uVar6;
      uStack_258 = uVar5;
      uStack_250 = uVar7;
      uStack_248 = uVar8;
      local_160 = uVar6;
      uStack_158 = uVar5;
      uStack_150 = uVar7;
      uStack_148 = uVar8;
    }
    local_11c = local_1ac;
    local_130 = local_1ac;
    uStack_12c = local_1ac;
    uStack_128 = local_1ac;
    uStack_124 = local_1ac;
    for (; local_21c + 3 < local_1c4; local_21c = local_21c + 4) {
      local_118 = local_1d0;
      local_280 = *(float (*) [2])local_1d0;
      uVar6 = *(undefined8 *)(local_1d0 + 2);
      afStack_278 = (float  [2])uVar6;
      afVar9 = BinaryOp_x86_fma_functor::binary_op_min::func_pack4
                         (local_1b9,(__m128 *)local_280,&local_270);
      local_280 = afVar9._0_8_;
      local_100 = local_1d0;
      *(float (*) [2])local_1d0 = local_280;
      *(undefined8 *)(local_1d0 + 2) = uVar6;
      local_1d0 = local_1d0 + 4;
      afStack_278 = (float  [2])uVar6;
      local_110 = local_280;
      afStack_108 = (float  [2])uVar6;
    }
    for (; local_21c < local_1c4; local_21c = local_21c + 1) {
      fVar3 = BinaryOp_x86_fma_functor::binary_op_min::func
                        (in_stack_fffffffffffffd48,*in_stack_fffffffffffffd40,(float *)0x1119d8b);
      *local_1d0 = fVar3;
      local_1d0 = local_1d0 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps((float)b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr, b);
            ptr++;
        }
    }

    return 0;
}